

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.cpp
# Opt level: O2

void calc0<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
               (options2 *opt)

{
  string *__lhs;
  long lVar1;
  bool bVar2;
  type_conflict6 tVar3;
  ostream *poVar4;
  invalid_argument *this;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *in_RCX;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *in_R8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_348;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_308;
  cpp_dec_float<50U,_int,_void> local_2c8;
  real_t Jy;
  real_t Jx;
  real_t beta;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_1e8;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_1a8;
  square local_168 [8];
  uint auStack_160 [2];
  uint local_158 [2];
  uint auStack_150 [2];
  uint local_148 [2];
  int local_140;
  undefined1 local_13c;
  fpclass_type local_138;
  int32_t iStack_134;
  cpp_dec_float<50U,_int,_void> local_128;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_e8;
  tc local_a8 [8];
  uint auStack_a0 [2];
  uint local_98 [2];
  uint auStack_90 [2];
  uint local_88 [2];
  int local_80;
  undefined1 local_7c;
  fpclass_type local_78;
  int32_t iStack_74;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  f;
  
  convert<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
            (&Jx,&opt->Jx);
  convert<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
            (&Jy,&opt->Jy);
  local_348.m_backend.data._M_elems._32_5_ = 0;
  local_348.m_backend.data._M_elems[9]._1_3_ = 0;
  local_348.m_backend.exp = 0;
  local_348.m_backend.neg = false;
  local_348.m_backend.data._M_elems[4] = 0;
  local_348.m_backend.data._M_elems[5] = 0;
  local_348.m_backend.data._M_elems._24_5_ = 0;
  local_348.m_backend.data._M_elems[7]._1_3_ = 0;
  local_348.m_backend.data._M_elems[0] = 0;
  local_348.m_backend.data._M_elems[1] = 0;
  local_348.m_backend.data._M_elems[2] = 0;
  local_348.m_backend.data._M_elems[3] = 0;
  local_308.base.m_backend.data._M_elems._32_5_ = 0;
  local_308.base.m_backend.data._M_elems[9]._1_3_ = 0;
  local_308.base.m_backend.exp = 0;
  local_308.base.m_backend.neg = false;
  local_308.base.m_backend.data._M_elems[4] = 0;
  local_308.base.m_backend.data._M_elems[5] = 0;
  local_308.base.m_backend.data._M_elems._24_5_ = 0;
  local_308.base.m_backend.data._M_elems[7]._1_3_ = 0;
  local_308.base.m_backend.data._M_elems[0] = 0;
  local_308.base.m_backend.data._M_elems[1] = 0;
  local_308.base.m_backend.data._M_elems[2] = 0;
  local_308.base.m_backend.data._M_elems[3] = 0;
  local_2c8.data._M_elems._32_5_ = 0;
  local_2c8.data._M_elems[9]._1_3_ = 0;
  local_2c8.exp = 0;
  local_2c8.neg = false;
  local_2c8.data._M_elems[4] = 0;
  local_2c8.data._M_elems[5] = 0;
  local_2c8.data._M_elems._24_5_ = 0;
  local_2c8.data._M_elems[7]._1_3_ = 0;
  local_2c8.data._M_elems[0] = 0;
  local_2c8.data._M_elems[1] = 0;
  local_2c8.data._M_elems[2] = 0;
  local_2c8.data._M_elems[3] = 0;
  __lhs = &opt->Tmin;
  bVar2 = std::operator==(__lhs,"tc");
  if (bVar2) {
LAB_00118939:
    local_a8 = (tc  [8])Jx.base.m_backend.data._M_elems._0_8_;
    auStack_a0[0] = Jx.base.m_backend.data._M_elems[2];
    auStack_a0[1] = Jx.base.m_backend.data._M_elems[3];
    local_98[0] = Jx.base.m_backend.data._M_elems[4];
    local_98[1] = Jx.base.m_backend.data._M_elems[5];
    auStack_90[0] = Jx.base.m_backend.data._M_elems[6];
    auStack_90[1] = Jx.base.m_backend.data._M_elems[7];
    local_88[0] = Jx.base.m_backend.data._M_elems[8];
    local_88[1] = Jx.base.m_backend.data._M_elems[9];
    local_80 = Jx.base.m_backend.exp;
    local_7c = Jx.base.m_backend.neg;
    local_78 = Jx.base.m_backend.fpclass;
    iStack_74 = Jx.base.m_backend.prec_elem;
    local_e8.base.m_backend.data._M_elems[0] = Jy.base.m_backend.data._M_elems[0];
    local_e8.base.m_backend.data._M_elems[1] = Jy.base.m_backend.data._M_elems[1];
    local_e8.base.m_backend.data._M_elems[2] = Jy.base.m_backend.data._M_elems[2];
    local_e8.base.m_backend.data._M_elems[3] = Jy.base.m_backend.data._M_elems[3];
    local_e8.base.m_backend.data._M_elems[4] = Jy.base.m_backend.data._M_elems[4];
    local_e8.base.m_backend.data._M_elems[5] = Jy.base.m_backend.data._M_elems[5];
    local_e8.base.m_backend.data._M_elems[6] = Jy.base.m_backend.data._M_elems[6];
    local_e8.base.m_backend.data._M_elems[7] = Jy.base.m_backend.data._M_elems[7];
    local_e8.base.m_backend.data._M_elems[8] = Jy.base.m_backend.data._M_elems[8];
    local_e8.base.m_backend.data._M_elems[9] = Jy.base.m_backend.data._M_elems[9];
    local_e8.base.m_backend.exp = Jy.base.m_backend.exp;
    local_e8.base.m_backend.neg = Jy.base.m_backend.neg;
    local_e8.base.m_backend.fpclass = Jy.base.m_backend.fpclass;
    local_e8.base.m_backend.prec_elem = Jy.base.m_backend.prec_elem;
    ising::tc::
    square<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
              ((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                *)&local_128,local_a8,&local_e8,in_RCX);
    local_2c8.data._M_elems._32_5_ = local_128.data._M_elems._32_5_;
    local_2c8.data._M_elems[9]._1_3_ = local_128.data._M_elems[9]._1_3_;
    local_2c8.data._M_elems[4] = local_128.data._M_elems[4];
    local_2c8.data._M_elems[5] = local_128.data._M_elems[5];
    local_2c8.data._M_elems._24_5_ = local_128.data._M_elems._24_5_;
    local_2c8.data._M_elems[7]._1_3_ = local_128.data._M_elems[7]._1_3_;
    local_2c8.data._M_elems[2] = local_128.data._M_elems[2];
    local_2c8.data._M_elems[3] = local_128.data._M_elems[3];
    local_2c8.exp = local_128.exp;
    local_2c8.neg = local_128.neg;
    local_2c8.fpclass = local_128.fpclass;
    local_2c8.prec_elem = local_128.prec_elem;
    local_308.base.m_backend.data._M_elems[0] = local_128.data._M_elems[0];
    local_308.base.m_backend.data._M_elems[1] = local_128.data._M_elems[1];
    local_308.base.m_backend.data._M_elems[2] = local_128.data._M_elems[2];
    local_308.base.m_backend.data._M_elems[3] = local_128.data._M_elems[3];
    local_308.base.m_backend.data._M_elems[4] = local_128.data._M_elems[4];
    local_308.base.m_backend.data._M_elems[5] = local_128.data._M_elems[5];
    local_308.base.m_backend.exp = local_128.exp;
    local_308.base.m_backend.neg = local_128.neg;
    local_308.base.m_backend.fpclass = local_128.fpclass;
    local_308.base.m_backend.prec_elem = local_128.prec_elem;
    local_348.m_backend.data._M_elems[4] = local_128.data._M_elems[4];
    local_348.m_backend.data._M_elems[5] = local_128.data._M_elems[5];
    local_348.m_backend.data._M_elems[0] = local_128.data._M_elems[0];
    local_348.m_backend.data._M_elems[1] = local_128.data._M_elems[1];
    local_348.m_backend.data._M_elems[2] = local_128.data._M_elems[2];
    local_348.m_backend.data._M_elems[3] = local_128.data._M_elems[3];
    local_348.m_backend.exp = local_128.exp;
    local_348.m_backend.neg = local_128.neg;
    local_348.m_backend.fpclass = local_128.fpclass;
    local_348.m_backend.prec_elem = local_128.prec_elem;
    local_348.m_backend.data._M_elems._24_5_ = local_2c8.data._M_elems._24_5_;
    local_348.m_backend.data._M_elems[7]._1_3_ = local_2c8.data._M_elems[7]._1_3_;
    local_348.m_backend.data._M_elems._32_5_ = local_2c8.data._M_elems._32_5_;
    local_348.m_backend.data._M_elems[9]._1_3_ = local_2c8.data._M_elems[9]._1_3_;
    local_308.base.m_backend.data._M_elems._24_5_ = local_2c8.data._M_elems._24_5_;
    local_308.base.m_backend.data._M_elems[7]._1_3_ = local_2c8.data._M_elems[7]._1_3_;
    local_308.base.m_backend.data._M_elems._32_5_ = local_2c8.data._M_elems._32_5_;
    local_308.base.m_backend.data._M_elems[9]._1_3_ = local_2c8.data._M_elems[9]._1_3_;
  }
  else {
    bVar2 = std::operator==(__lhs,"Tc");
    if (bVar2) goto LAB_00118939;
    convert<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
              ((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                *)&local_128,__lhs);
    local_348.m_backend.data._M_elems._32_5_ = local_128.data._M_elems._32_5_;
    local_348.m_backend.data._M_elems[9]._1_3_ = local_128.data._M_elems[9]._1_3_;
    local_348.m_backend.data._M_elems[4] = local_128.data._M_elems[4];
    local_348.m_backend.data._M_elems[5] = local_128.data._M_elems[5];
    local_348.m_backend.data._M_elems._24_5_ = local_128.data._M_elems._24_5_;
    local_348.m_backend.data._M_elems[7]._1_3_ = local_128.data._M_elems[7]._1_3_;
    local_348.m_backend.data._M_elems[0] = local_128.data._M_elems[0];
    local_348.m_backend.data._M_elems[1] = local_128.data._M_elems[1];
    local_348.m_backend.data._M_elems[2] = local_128.data._M_elems[2];
    local_348.m_backend.data._M_elems[3] = local_128.data._M_elems[3];
    local_348.m_backend.exp = local_128.exp;
    local_348.m_backend.neg = local_128.neg;
    local_348.m_backend.fpclass = local_128.fpclass;
    local_348.m_backend.prec_elem = local_128.prec_elem;
    convert<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
              ((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                *)&local_128,&opt->Tmax);
    local_308.base.m_backend.data._M_elems._32_5_ = local_128.data._M_elems._32_5_;
    local_308.base.m_backend.data._M_elems[9]._1_3_ = local_128.data._M_elems[9]._1_3_;
    local_308.base.m_backend.data._M_elems[4] = local_128.data._M_elems[4];
    local_308.base.m_backend.data._M_elems[5] = local_128.data._M_elems[5];
    local_308.base.m_backend.data._M_elems._24_5_ = local_128.data._M_elems._24_5_;
    local_308.base.m_backend.data._M_elems[7]._1_3_ = local_128.data._M_elems[7]._1_3_;
    local_308.base.m_backend.data._M_elems[0] = local_128.data._M_elems[0];
    local_308.base.m_backend.data._M_elems[1] = local_128.data._M_elems[1];
    local_308.base.m_backend.data._M_elems[2] = local_128.data._M_elems[2];
    local_308.base.m_backend.data._M_elems[3] = local_128.data._M_elems[3];
    local_308.base.m_backend.exp = local_128.exp;
    local_308.base.m_backend.neg = local_128.neg;
    local_308.base.m_backend.fpclass = local_128.fpclass;
    local_308.base.m_backend.prec_elem = local_128.prec_elem;
    convert<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
              ((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                *)&local_128,&opt->dT);
    local_2c8.data._M_elems._32_5_ = local_128.data._M_elems._32_5_;
    local_2c8.data._M_elems[9]._1_3_ = local_128.data._M_elems[9]._1_3_;
    local_2c8.data._M_elems[4] = local_128.data._M_elems[4];
    local_2c8.data._M_elems[5] = local_128.data._M_elems[5];
    local_2c8.data._M_elems._24_5_ = local_128.data._M_elems._24_5_;
    local_2c8.data._M_elems[7]._1_3_ = local_128.data._M_elems[7]._1_3_;
    local_2c8.data._M_elems[2] = local_128.data._M_elems[2];
    local_2c8.data._M_elems[3] = local_128.data._M_elems[3];
    local_2c8.exp = local_128.exp;
    local_2c8.neg = local_128.neg;
    local_2c8.fpclass = local_128.fpclass;
    local_2c8.prec_elem = local_128.prec_elem;
  }
  local_128.data._M_elems._0_8_ = local_128.data._M_elems._0_8_ & 0xffffffff00000000;
  tVar3 = boost::multiprecision::operator<(&local_348,(int *)&local_128);
  if (!tVar3) {
    beta.base.m_backend.data._M_elems[0] = 0;
    tVar3 = boost::multiprecision::operator<(&local_308.base,(int *)&beta);
    if (!tVar3) {
      tVar3 = boost::multiprecision::operator>(&local_348,&local_308.base);
      if (tVar3) {
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this,"Tmax should be larger than Tmin");
      }
      else {
        local_128.data._M_elems._0_8_ = local_128.data._M_elems._0_8_ & 0xffffffff00000000;
        tVar3 = boost::multiprecision::operator<=
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                            *)&local_2c8,(int *)&local_128);
        lVar1 = std::cout;
        if (!tVar3) {
          *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
               *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) &
               0xfffffefb | 0x100;
          *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) =
               0x32;
          poVar4 = std::operator<<((ostream *)&std::cout,"# lattice: square\n");
          poVar4 = std::operator<<(poVar4,"# precision: ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x32);
          poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
          std::operator<<(poVar4,"# Lx Ly Jx Jy T 1/T F/N E/N C/N\n");
          local_128.data._M_elems[9]._1_3_ = local_348.m_backend.data._M_elems[9]._1_3_;
          local_128.data._M_elems._32_5_ = local_348.m_backend.data._M_elems._32_5_;
          local_128.data._M_elems[7]._1_3_ = local_348.m_backend.data._M_elems[7]._1_3_;
          local_128.data._M_elems._24_5_ = local_348.m_backend.data._M_elems._24_5_;
          local_128.data._M_elems[4] = local_348.m_backend.data._M_elems[4];
          local_128.data._M_elems[5] = local_348.m_backend.data._M_elems[5];
          local_128.data._M_elems[0] = local_348.m_backend.data._M_elems[0];
          local_128.data._M_elems[1] = local_348.m_backend.data._M_elems[1];
          local_128.data._M_elems[2] = local_348.m_backend.data._M_elems[2];
          local_128.data._M_elems[3] = local_348.m_backend.data._M_elems[3];
          local_128.exp = local_348.m_backend.exp;
          local_128.neg = local_348.m_backend.neg;
          local_128.fpclass = local_348.m_backend.fpclass;
          local_128.prec_elem = local_348.m_backend.prec_elem;
          while( true ) {
            operator*(&f,0.0001,
                      (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                       *)&local_2c8);
            operator+(&beta,&local_308,&f);
            tVar3 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                                *)&local_128,&beta.base);
            if (!tVar3) break;
            operator/(&beta,1,(mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                               *)&local_128);
            local_168 = (square  [8])Jx.base.m_backend.data._M_elems._0_8_;
            auStack_160[0] = Jx.base.m_backend.data._M_elems[2];
            auStack_160[1] = Jx.base.m_backend.data._M_elems[3];
            local_158[0] = Jx.base.m_backend.data._M_elems[4];
            local_158[1] = Jx.base.m_backend.data._M_elems[5];
            auStack_150[0] = Jx.base.m_backend.data._M_elems[6];
            auStack_150[1] = Jx.base.m_backend.data._M_elems[7];
            local_148[0] = Jx.base.m_backend.data._M_elems[8];
            local_148[1] = Jx.base.m_backend.data._M_elems[9];
            local_140 = Jx.base.m_backend.exp;
            local_13c = Jx.base.m_backend.neg;
            local_138 = Jx.base.m_backend.fpclass;
            iStack_134 = Jx.base.m_backend.prec_elem;
            local_1a8.base.m_backend.data._M_elems[0] = Jy.base.m_backend.data._M_elems[0];
            local_1a8.base.m_backend.data._M_elems[1] = Jy.base.m_backend.data._M_elems[1];
            local_1a8.base.m_backend.data._M_elems[2] = Jy.base.m_backend.data._M_elems[2];
            local_1a8.base.m_backend.data._M_elems[3] = Jy.base.m_backend.data._M_elems[3];
            local_1a8.base.m_backend.data._M_elems[4] = Jy.base.m_backend.data._M_elems[4];
            local_1a8.base.m_backend.data._M_elems[5] = Jy.base.m_backend.data._M_elems[5];
            local_1a8.base.m_backend.data._M_elems[6] = Jy.base.m_backend.data._M_elems[6];
            local_1a8.base.m_backend.data._M_elems[7] = Jy.base.m_backend.data._M_elems[7];
            local_1a8.base.m_backend.data._M_elems[8] = Jy.base.m_backend.data._M_elems[8];
            local_1a8.base.m_backend.data._M_elems[9] = Jy.base.m_backend.data._M_elems[9];
            local_1a8.base.m_backend.exp = Jy.base.m_backend.exp;
            local_1a8.base.m_backend.neg = Jy.base.m_backend.neg;
            local_1a8.base.m_backend.fpclass = Jy.base.m_backend.fpclass;
            local_1a8.base.m_backend.prec_elem = Jy.base.m_backend.prec_elem;
            local_1e8.base.m_backend.data._M_elems[1] = beta.base.m_backend.data._M_elems[1];
            local_1e8.base.m_backend.data._M_elems[0] = beta.base.m_backend.data._M_elems[0];
            local_1e8.base.m_backend.data._M_elems[2] = beta.base.m_backend.data._M_elems[2];
            local_1e8.base.m_backend.data._M_elems[3] = beta.base.m_backend.data._M_elems[3];
            local_1e8.base.m_backend.data._M_elems[4] = beta.base.m_backend.data._M_elems[4];
            local_1e8.base.m_backend.data._M_elems[5] = beta.base.m_backend.data._M_elems[5];
            local_1e8.base.m_backend.data._M_elems[6] = beta.base.m_backend.data._M_elems[6];
            local_1e8.base.m_backend.data._M_elems[7] = beta.base.m_backend.data._M_elems[7];
            local_1e8.base.m_backend.data._M_elems[8] = beta.base.m_backend.data._M_elems[8];
            local_1e8.base.m_backend.data._M_elems[9] = beta.base.m_backend.data._M_elems[9];
            local_1e8.base.m_backend.exp = beta.base.m_backend.exp;
            local_1e8.base.m_backend.neg = beta.base.m_backend.neg;
            local_1e8.base.m_backend.fpclass = beta.base.m_backend.fpclass;
            local_1e8.base.m_backend.prec_elem = beta.base.m_backend.prec_elem;
            ising::free_energy::square::
            infinite<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                      (&f,local_168,&local_1a8,&local_1e8,in_R8);
            poVar4 = std::operator<<((ostream *)&std::cout,"inf inf ");
            poVar4 = boost::multiprecision::operator<<(poVar4,&Jx.base);
            poVar4 = std::operator<<(poVar4,' ');
            poVar4 = boost::multiprecision::operator<<(poVar4,&Jy.base);
            poVar4 = std::operator<<(poVar4,' ');
            poVar4 = boost::multiprecision::operator<<
                               (poVar4,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                                        *)&local_128);
            poVar4 = std::operator<<(poVar4,' ');
            poVar4 = boost::multiprecision::operator<<(poVar4,&beta.base);
            poVar4 = std::operator<<(poVar4,' ');
            poVar4 = boost::multiprecision::operator<<(poVar4,&f.base);
            poVar4 = std::operator<<(poVar4," N/A N/A");
            std::endl<char,std::char_traits<char>>(poVar4);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_128,&local_2c8);
          }
          return;
        }
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this,"dT should be positive");
      }
      goto LAB_00118f19;
    }
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Temperature should be positive");
LAB_00118f19:
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void calc0(const options2& opt) {
  using namespace ising::free_energy;
  typedef T real_t;
  real_t Jx = convert<real_t>(opt.Jx);
  real_t Jy = convert<real_t>(opt.Jy);
  real_t Tmin, Tmax, dT;
  if (opt.Tmin == "tc" || opt.Tmin == "Tc") {
    Tmin = Tmax = dT = ising::tc::square(Jx, Jy);
  } else {
    Tmin = convert<real_t>(opt.Tmin);
    Tmax = convert<real_t>(opt.Tmax);
    dT = convert<real_t>(opt.dT);
  }
  if (Tmin < 0 || Tmax < 0)
    throw(std::invalid_argument("Temperature should be positive"));
  if (Tmin > Tmax)
    throw(std::invalid_argument("Tmax should be larger than Tmin"));
  if (dT <= 0)
    throw(std::invalid_argument("dT should be positive"));
  std::cout << std::scientific
            << std::setprecision(std::numeric_limits<real_t>::digits10)
            << "# lattice: square\n"
            << "# precision: " << std::numeric_limits<real_t>::digits10
            << std::endl
            << "# Lx Ly Jx Jy T 1/T F/N E/N C/N\n";
  for (auto t = Tmin; t < Tmax + 1e-4 * dT; t += dT) {
    real_t beta = 1 / t;
    auto f = square::infinite(Jx, Jy, beta);
    std::cout << "inf inf " << Jx << ' ' << Jy << ' ' << t << ' ' << beta << ' '
              << f << " N/A N/A" << std::endl;
  }
}